

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::ConstructorOp::evaluate(ConstructorOp *this,ExecutionContext *evalCtx)

{
  pointer ppEVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  VariableType *pVVar5;
  VariableType *pVVar6;
  uint uVar7;
  long extraout_RDX;
  ulong uVar8;
  __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  __tmp;
  pointer ppEVar9;
  ulong uVar10;
  long lVar11;
  VariableType *this_00;
  
  ppEVar9 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar9 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      ppEVar1 = ppEVar9 + -1;
      ppEVar9 = ppEVar9 + -1;
      (*(*ppEVar1)->_vptr_Expression[4])(*ppEVar1,evalCtx);
    } while (ppEVar9 !=
             (this->m_inputExpressions).
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  iVar3 = VariableType::getScalarSize(&(this->m_valueRange).m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_value).m_value,(long)(iVar3 << 6));
  ppEVar9 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar9 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pSVar2 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar3 = 0;
    do {
      iVar4 = (*ppEVar9[-1]->_vptr_Expression[5])();
      this_00 = (VariableType *)CONCAT44(extraout_var,iVar4);
      if (0 < this_00->m_numElements) {
        iVar4 = 0;
        lVar11 = 0;
        do {
          pVVar5 = VariableType::getElementType(this_00);
          pVVar6 = VariableType::getElementType(&(this->m_valueRange).m_type);
          uVar7 = pVVar5->m_baseType - TYPE_FLOAT;
          uVar8 = (ulong)uVar7;
          if (2 < uVar7) {
            uVar8 = 0xffffffffffffffff;
          }
          uVar7 = pVVar6->m_baseType - TYPE_FLOAT;
          uVar10 = 0xffffffffffffffff;
          if (uVar7 < 3) {
            uVar10 = (ulong)uVar7;
          }
          (**(code **)(rsg::(anonymous_namespace)::
                       convertExecValue(rsg::ConstStridedValueAccess<int>,rsg::StridedValueAccess<int>)
                       ::convTable + uVar10 * 8 + uVar8 * 0x18))
                    (pVVar5,extraout_RDX + (long)iVar4 * 4,pVVar6,pSVar2 + (iVar4 + iVar3 * 0x40));
          lVar11 = lVar11 + 1;
          iVar4 = iVar4 + 0x40;
        } while (lVar11 < this_00->m_numElements);
        iVar3 = iVar3 + (int)lVar11;
      }
      ppEVar9 = ppEVar9 + -1;
    } while (ppEVar9 !=
             (this->m_inputExpressions).
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ConstructorOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate children
	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
		(*i)->evaluate(evalCtx);

	// Compute value
	const VariableType& type = m_valueRange.getType();
	m_value.setStorage(type);

	ExecValueAccess	dst				= m_value.getValue(type);
	int				curScalarNdx	= 0;

	for (vector<Expression*>::reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		ExecConstValueAccess src = (*i)->getValue();

		for (int elemNdx = 0; elemNdx < src.getType().getNumElements(); elemNdx++)
			convertExecValue(src.component(elemNdx), dst.component(curScalarNdx++));
	}
}